

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O1

void b64To(void *dest,size_t *count,char *src)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  ulong uVar5;
  
  uVar5 = strLen(src);
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else if (src[uVar5 - 1] == '=') {
    uVar5 = uVar5 + ~(ulong)(src[uVar5 - 2] == '=');
  }
  *count = (ulong)((uint)uVar5 & 1) + (uVar5 >> 2) * 3 + (ulong)(((uint)uVar5 >> 1 & 1) != 0);
  if (dest != (void *)0x0) {
    for (; 3 < uVar5; uVar5 = uVar5 - 4) {
      bVar1 = b64_dec_table[(byte)*src];
      bVar2 = b64_dec_table[((byte *)src)[1]];
      bVar3 = b64_dec_table[((byte *)src)[2]];
      *(byte *)((long)dest + 2) = bVar3 << 6 | b64_dec_table[((byte *)src)[3]];
      *(char *)((long)dest + 1) = (char)(((uint)bVar2 << 6 | (uint)bVar3) >> 2);
      *(char *)dest = (char)(((uint)bVar1 << 0xc | (uint)bVar2 << 6) >> 10);
      src = (char *)((byte *)src + 4);
      dest = (void *)((long)dest + 3);
    }
    if (uVar5 == 2) {
      uVar4 = (undefined1)
              (((uint)b64_dec_table[((byte *)src)[1]] | (uint)b64_dec_table[(byte)*src] << 6) >> 4);
    }
    else {
      if (uVar5 != 3) {
        return;
      }
      bVar1 = b64_dec_table[(byte)*src];
      bVar2 = b64_dec_table[((byte *)src)[1]];
      *(char *)((long)dest + 1) =
           (char)(((uint)b64_dec_table[((byte *)src)[2]] | (uint)bVar2 << 6) >> 2);
      uVar4 = (undefined1)(((uint)bVar1 << 0xc | (uint)bVar2 << 6) >> 10);
    }
    *(undefined1 *)dest = uVar4;
  }
  return;
}

Assistant:

void b64To(void* dest, size_t* count, const char* src)
{
	register u32 block;
	size_t len;
	ASSERT(b64IsValid(src));
	ASSERT(memIsValid(count, sizeof(size_t)));
	ASSERT(memIsNullOrValid(dest, *count));
	// размер dest
	len = strLen(src);
	if (len && src[len - 1] == '=' && src[--len - 1] == '=')
		--len;
	ASSERT(dest ? *count >= 3 * (len / 4) + (len & 1) + (len >> 1 & 1) : TRUE);
	*count = 3 * (len / 4) + (len & 1) + (len >> 1 & 1);
	if (dest == 0)
		return;
	// декодировать
	ASSERT(memIsDisjoint2(src, strLen(src) + 1, dest, *count));
	for (; len >= 4; len -= 4)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block <<= 6;
		block |= b64_dec_table[(octet)src[2]], block <<= 6;
		block |= b64_dec_table[(octet)src[3]];
		((octet*)dest)[2] = block & 255, block >>= 8;
		((octet*)dest)[1] = block & 255, block >>= 8;
		((octet*)dest)[0] = block;
		src += 4;
		dest = (octet*)dest + 3;
	}
	if (len == 3)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block <<= 6;
		block |= b64_dec_table[(octet)src[2]], block >>= 2;
		((octet*)dest)[1] = block & 255, block >>= 8;
		((octet*)dest)[0] = block;
	}
	else if (len == 2)
	{
		block  = b64_dec_table[(octet)src[0]], block <<= 6;
		block |= b64_dec_table[(octet)src[1]], block >>= 4;
		((octet*)dest)[0] = block;
	}
	block = 0;
}